

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

void __thiscall ON_wString::TrimRight(ON_wString *this,wchar_t *s)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  int iVar3;
  ON_Internal_Empty_wString *pOVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  
  pwVar2 = this->m_s;
  pOVar4 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
  if (pwVar2 == (wchar_t *)0x0) {
    pOVar4 = &empty_wstring;
  }
  uVar6 = (ulong)(pOVar4->header).string_length;
  if ((long)uVar6 < 1) {
    return;
  }
  if (s == (wchar_t *)0x0) {
    do {
      if ((long)uVar6 < 1) goto LAB_00681eb0;
      if (this->m_s[uVar6 - 1] < L'\x01') {
        uVar6 = (ulong)((int)uVar6 - 1);
        break;
      }
      iVar3 = ON_IsUnicodeSpaceOrControlCodePoint(this->m_s[uVar6 - 1]);
      uVar6 = uVar6 - 1;
    } while (iVar3 != 0);
  }
  else {
    do {
      if ((long)uVar6 < 1) goto LAB_00681eb0;
      uVar6 = uVar6 - 1;
      pwVar5 = s;
      if (pwVar2[uVar6] == L'\0') break;
      do {
        wVar1 = *pwVar5;
        if (wVar1 == L'\0') break;
        pwVar5 = pwVar5 + 1;
      } while (wVar1 != pwVar2[uVar6]);
    } while (wVar1 != L'\0');
  }
LAB_00681ebb:
  if (-1 < (int)uVar6) {
    if (this->m_s[(uVar6 & 0xffffffff) + 1] != L'\0') {
      CopyArray(this);
      pwVar2 = this->m_s;
      pwVar2[(uVar6 & 0xffffffff) + 1] = L'\0';
      pOVar4 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
      if (pwVar2 == (wchar_t *)0x0) {
        pOVar4 = &empty_wstring;
      }
      (pOVar4->header).string_length = (int)uVar6 + 1;
    }
    return;
  }
  Destroy(this);
  return;
LAB_00681eb0:
  uVar6 = 0xffffffff;
  goto LAB_00681ebb;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}